

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix_func.c
# Opt level: O1

void xc_mix_init(xc_func_type *p,int n_funcs,int *funcs_id,double *mix_coef)

{
  double *pdVar1;
  xc_func_type **ppxVar2;
  xc_func_type *pxVar3;
  ulong uVar4;
  
  p->n_func_aux = n_funcs;
  pdVar1 = (double *)malloc((long)n_funcs * 8);
  p->mix_coef = pdVar1;
  ppxVar2 = (xc_func_type **)malloc((long)n_funcs * 8);
  p->func_aux = ppxVar2;
  if (0 < n_funcs) {
    uVar4 = 0;
    do {
      p->mix_coef[uVar4] = mix_coef[uVar4];
      pxVar3 = (xc_func_type *)malloc(0x1a0);
      p->func_aux[uVar4] = pxVar3;
      xc_func_init(p->func_aux[uVar4],funcs_id[uVar4],p->nspin);
      uVar4 = uVar4 + 1;
    } while ((uint)n_funcs != uVar4);
  }
  p->cam_beta = 0.0;
  p->nlc_b = 0.0;
  p->cam_omega = 0.0;
  p->cam_alpha = 0.0;
  p->nlc_C = 0.0;
  return;
}

Assistant:

void
xc_mix_init(xc_func_type *p, int n_funcs, const int *funcs_id, const double *mix_coef)
{
  int ii;

  assert(p != NULL);
  assert(p->func_aux == NULL && p->mix_coef == NULL);

  /* allocate structures needed for mixed functional */
  p->n_func_aux = n_funcs;
  p->mix_coef   = (double *) libxc_malloc(n_funcs*sizeof(double));
  p->func_aux   = (xc_func_type **) libxc_malloc(n_funcs*sizeof(xc_func_type *));

  for(ii=0; ii<n_funcs; ii++){
    p->mix_coef[ii] = mix_coef[ii];
    p->func_aux[ii] = (xc_func_type *) libxc_malloc(sizeof(xc_func_type));
    xc_func_init (p->func_aux[ii], funcs_id[ii], p->nspin);
  }

  /* initialize variables */
  p->cam_alpha = 0.0;
  p->cam_beta  = 0.0;
  p->cam_omega = 0.0;
  p->nlc_b     = 0.0;
  p->nlc_C     = 0.0;
}